

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O0

void __thiscall cmVariableWatchCommand::~cmVariableWatchCommand(cmVariableWatchCommand *this)

{
  bool bVar1;
  cmake *this_00;
  cmVariableWatch *this_01;
  reference variable;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  const_iterator it;
  cmVariableWatchCommand *this_local;
  
  (this->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmVariableWatchCommand_00c1b980;
  it._M_node = (_Base_ptr)this;
  std::
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Rb_tree_const_iterator(&local_18);
  local_20 = (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->WatchedVariables);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->WatchedVariables);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    this_01 = cmake::GetVariableWatch(this_00);
    variable = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_18);
    cmVariableWatch::RemoveWatch
              (this_01,variable,cmVariableWatchCommandVariableAccessed,(void *)0x0);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_18);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->WatchedVariables);
  cmCommand::~cmCommand(&this->super_cmCommand);
  return;
}

Assistant:

cmVariableWatchCommand::~cmVariableWatchCommand()
{
  std::set<std::string>::const_iterator it;
  for ( it = this->WatchedVariables.begin();
        it != this->WatchedVariables.end();
        ++it )
    {
    this->Makefile->GetCMakeInstance()->GetVariableWatch()->RemoveWatch(
      *it, cmVariableWatchCommandVariableAccessed);
    }
}